

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_factory.cpp
# Opt level: O1

sink_ptr __thiscall
bidfx_public_api::tools::LoggerFactory::AddDailyFileLogger
          (LoggerFactory *this,string *base_filename)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  sink_ptr sVar2;
  undefined1 local_31;
  int local_30 [2];
  daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_30[1] = 0;
  local_30[0] = 0;
  local_28 = (daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<spdlog::sinks::daily_file_sink<std::mutex,spdlog::sinks::daily_filename_calculator>,std::allocator<spdlog::sinks::daily_file_sink<std::mutex,spdlog::sinks::daily_filename_calculator>>,std::__cxx11::string&,int,int>
            (&local_20,&local_28,
             (allocator<spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>_>
              *)&local_31,base_filename,local_30 + 1,local_30);
  _Var1._M_pi = local_20._M_pi;
  *(daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> **)this = local_28;
  *(undefined8 *)(this + 8) = 0;
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  AddSink((sink_ptr *)this);
  sVar2.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (sink_ptr)sVar2.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

spdlog::sink_ptr LoggerFactory::AddDailyFileLogger(std::string base_filename)
{
    spdlog::sink_ptr sink = std::make_shared<spdlog::sinks::daily_file_sink_mt>(base_filename, 0, 0);
    AddSink(sink);
    return sink;
}